

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

WithinUlpsMatcher * Catch::Matchers::WithinULP(double target,uint64_t maxUlpDiff)

{
  WithinUlpsMatcher *in_RDI;
  FloatingPointKind in_stack_0000003f;
  uint64_t in_stack_00000040;
  double in_stack_00000048;
  WithinUlpsMatcher *in_stack_00000050;
  
  Floating::WithinUlpsMatcher::WithinUlpsMatcher
            (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003f);
  return in_RDI;
}

Assistant:

Floating::WithinUlpsMatcher WithinULP(double target, uint64_t maxUlpDiff) {
    return Floating::WithinUlpsMatcher(target, maxUlpDiff, Floating::FloatingPointKind::Double);
}